

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O3

void __thiscall
dg::pta::PointerAnalysisFS::getMemoryObjects
          (PointerAnalysisFS *this,PSNode *where,Pointer *pointer,
          vector<dg::pta::MemoryObject_*,_std::allocator<dg::pta::MemoryObject_*>_> *objects)

{
  int iVar1;
  _Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
  *this_00;
  PSNode *pPVar2;
  iterator iVar3;
  __uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> _Var4;
  _Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
  *p_Var5;
  tuple<dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_> tVar6;
  _Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
  *p_Var7;
  MemoryObject *mo;
  _Head_base<0UL,_dg::pta::MemoryObject_*,_false> local_38;
  __uniq_ptr_impl<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> local_30;
  
  this_00 = *(_Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
              **)(where + 0x10);
  p_Var7 = *(_Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
             **)(this_00 + 0x10);
  if (p_Var7 != (_Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
                 *)0x0) {
    pPVar2 = pointer->target;
    p_Var5 = this_00 + 8;
    do {
      if (*(PSNode **)(p_Var7 + 0x20) >= pPVar2) {
        p_Var5 = p_Var7;
      }
      p_Var7 = *(_Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
                 **)(p_Var7 + (ulong)(*(PSNode **)(p_Var7 + 0x20) < pPVar2) * 8 + 0x10);
    } while (p_Var7 != (_Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
                        *)0x0);
    if ((p_Var5 != this_00 + 8) && (*(PSNode **)(p_Var5 + 0x20) <= pPVar2)) {
      local_38._M_head_impl = *(MemoryObject **)(p_Var5 + 0x28);
      iVar3._M_current = *(MemoryObject ***)(objects + 8);
      if (iVar3._M_current == *(MemoryObject ***)(objects + 0x10)) {
        std::vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>>::
        _M_realloc_insert<dg::pta::MemoryObject*>
                  ((vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>> *)objects,
                   iVar3,&local_38._M_head_impl);
      }
      else {
        *iVar3._M_current = local_38._M_head_impl;
        *(long *)(objects + 8) = *(long *)(objects + 8) + 8;
      }
    }
  }
  if (*(long *)objects != *(long *)(objects + 8)) {
    return;
  }
  iVar1 = *(int *)(where + 0x90);
  if (iVar1 < 10) {
    if (iVar1 == 3) goto LAB_0011a2b1;
  }
  else {
    if (iVar1 == 0x14) goto LAB_0011a2b1;
    if (iVar1 != 10) {
      return;
    }
    iVar1 = *(int *)(*(long *)(where + 0x98) + 0x90);
  }
  if (iVar1 != 9) {
    return;
  }
LAB_0011a2b1:
  tVar6.super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
  .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>)
       operator_new(0x38);
  *(PSNode **)
   tVar6.
   super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
   super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl = pointer->target;
  (((_Rb_tree_header *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
          .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x10))->_M_header).
  _M_color = _S_red;
  *(_Base_ptr *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
          .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x18) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
          .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x20) =
       (_Rb_tree_header *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
              .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x10);
  *(_Rb_tree_header **)
   ((long)tVar6.
          super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
          .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x28) =
       (_Rb_tree_header *)
       ((long)tVar6.
              super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
              .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x10);
  *(size_t *)
   ((long)tVar6.
          super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
          .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x30) = 0;
  local_38._M_head_impl =
       (MemoryObject *)
       tVar6.
       super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
       super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
  super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl =
       (tuple<dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>)
       (tuple<dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>)
       tVar6.
       super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
       super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
  std::
  _Rb_tree<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>,std::_Select1st<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>
  ::
  _M_emplace_unique<dg::pta::PSNode*const&,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>
            (this_00,&pointer->target,
             (unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
             &local_30);
  _Var4._M_t.
  super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
  super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl =
       local_30._M_t.
       super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
       super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
  if ((_Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>)
      local_30._M_t.
      super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>.
      super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl != (MemoryObject *)0x0) {
    std::
    _Rb_tree<dg::Offset,_std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>,_std::_Select1st<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
    ::_M_erase((_Rb_tree<dg::Offset,_std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>,_std::_Select1st<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                *)((long)local_30._M_t.
                         super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
                         .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 8),
               *(_Link_type *)
                ((long)local_30._M_t.
                       super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
                       .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl + 0x18));
    operator_delete((void *)_Var4._M_t.
                            super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
                            .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl,0x38
                   );
  }
  iVar3._M_current = *(MemoryObject ***)(objects + 8);
  if (iVar3._M_current == *(MemoryObject ***)(objects + 0x10)) {
    std::vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>>::
    _M_realloc_insert<dg::pta::MemoryObject*const&>
              ((vector<dg::pta::MemoryObject*,std::allocator<dg::pta::MemoryObject*>> *)objects,
               iVar3,&local_38._M_head_impl);
  }
  else {
    *iVar3._M_current =
         (MemoryObject *)
         tVar6.
         super__Tuple_impl<0UL,_dg::pta::MemoryObject_*,_std::default_delete<dg::pta::MemoryObject>_>
         .super__Head_base<0UL,_dg::pta::MemoryObject_*,_false>._M_head_impl;
    *(long *)(objects + 8) = *(long *)(objects + 8) + 8;
  }
  return;
}

Assistant:

void getMemoryObjects(PSNode *where, const Pointer &pointer,
                          std::vector<MemoryObject *> &objects) override {
        MemoryMapT *mm = where->getData<MemoryMapT>();
        assert(mm && "Node does not have memory map");

        auto I = mm->find(pointer.target);
        if (I != mm->end()) {
            objects.push_back(I->second.get());
        }

        // if we haven't found any memory object, but this psnode
        // is a write to memory, create a new one, so that
        // the write has something to write to
        if (objects.empty() && canChangeMM(where)) {
            MemoryObject *mo = new MemoryObject(pointer.target);
            mm->emplace(pointer.target, std::unique_ptr<MemoryObject>(mo));
            objects.push_back(mo);
        }
    }